

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

Parameters * GGWave::getDefaultParameters(void)

{
  return &getDefaultParameters::result;
}

Assistant:

const GGWave::Parameters & GGWave::getDefaultParameters() {
    static ggwave_Parameters result {
        -1, // vaiable payload length
        kDefaultSampleRate,
        kDefaultSampleRate,
        kDefaultSampleRate,
        kDefaultSamplesPerFrame,
        kDefaultSoundMarkerThreshold,
        GGWAVE_SAMPLE_FORMAT_F32,
        GGWAVE_SAMPLE_FORMAT_F32,
        GGWAVE_OPERATING_MODE_RX | GGWAVE_OPERATING_MODE_TX,
    };

    return result;
}